

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> __thiscall
cmm::BinaryOperatorAST::tryFoldBinOpBitwise
          (BinaryOperatorAST *this,TokenKind TokenKind,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *LHS,
          unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *RHS)

{
  uint uVar1;
  ExpressionAST *pEVar2;
  _func_int **pp_Var3;
  pointer *__ptr;
  uint uVar4;
  int iVar5;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_28;
  _Head_base<0UL,_cmm::ExpressionAST_*,_false> local_20;
  
  local_20._M_head_impl =
       (LHS->_M_t).
       super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
       super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
       super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
  if ((((local_20._M_head_impl)->Kind != IntExpression) ||
      (pEVar2 = (RHS->_M_t).
                super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>
                .super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl,
      pEVar2->Kind != IntExpression)) || (4 < TokenKind - Amp)) {
    (LHS->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
    local_28._M_head_impl =
         (RHS->_M_t).
         super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>._M_t.
         super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
         super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl;
    (RHS->_M_t).super___uniq_ptr_impl<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>.
    _M_t.super__Tuple_impl<0UL,_cmm::ExpressionAST_*,_std::default_delete<cmm::ExpressionAST>_>.
    super__Head_base<0UL,_cmm::ExpressionAST_*,_false>._M_head_impl = (ExpressionAST *)0x0;
    create(this,TokenKind,
           (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_20,
           (unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_> *)&local_28);
    if (local_28._M_head_impl != (ExpressionAST *)0x0) {
      (*((local_28._M_head_impl)->super_AST)._vptr_AST[1])();
    }
    if (local_20._M_head_impl == (ExpressionAST *)0x0) {
      return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
              )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
                )this;
    }
    (*((local_20._M_head_impl)->super_AST)._vptr_AST[1])();
    return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
           )(__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>
             )this;
  }
  uVar1 = *(uint *)&(local_20._M_head_impl)->field_0xc;
  uVar4 = *(uint *)&pEVar2->field_0xc;
  switch(TokenKind) {
  case Amp:
    pp_Var3 = (_func_int **)operator_new(0x10);
    uVar4 = uVar4 & uVar1;
    break;
  case Pipe:
    pp_Var3 = (_func_int **)operator_new(0x10);
    uVar4 = uVar4 | uVar1;
    break;
  case LessLess:
    pp_Var3 = (_func_int **)operator_new(0x10);
    iVar5 = uVar1 << ((byte)uVar4 & 0x1f);
    goto LAB_00110fb4;
  case GreaterGreater:
    pp_Var3 = (_func_int **)operator_new(0x10);
    iVar5 = (int)uVar1 >> ((byte)uVar4 & 0x1f);
LAB_00110fb4:
    *(undefined4 *)(pp_Var3 + 1) = 0;
    *pp_Var3 = (_func_int *)&PTR__AST_0011f860;
    *(int *)((long)pp_Var3 + 0xc) = iVar5;
    goto LAB_00110fe4;
  case Caret:
    pp_Var3 = (_func_int **)operator_new(0x10);
    uVar4 = uVar4 ^ uVar1;
  }
  *(undefined4 *)(pp_Var3 + 1) = 0;
  *pp_Var3 = (_func_int *)&PTR__AST_0011f860;
  *(uint *)((long)pp_Var3 + 0xc) = uVar4;
LAB_00110fe4:
  (this->super_ExpressionAST).super_AST._vptr_AST = pp_Var3;
  return (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         (__uniq_ptr_data<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ExpressionAST>
BinaryOperatorAST::tryFoldBinOpBitwise(Token::TokenKind TokenKind,
                                       std::unique_ptr<ExpressionAST> LHS,
                                       std::unique_ptr<ExpressionAST> RHS) {
  if (LHS->isInt() && RHS->isInt()) {
    int L = LHS->as_cptr<IntAST>()->getValue();
    int R = RHS->as_cptr<IntAST>()->getValue();

    switch (TokenKind) {
    default:break;
    case Token::LessLess:
      return std::unique_ptr<IntAST>(new IntAST(L << R));
    case Token::GreaterGreater:
      return std::unique_ptr<IntAST>(new IntAST(L >> R));
    case Token::Amp:
      return std::unique_ptr<IntAST>(new IntAST(L & R));
    case Token::Pipe:
      return std::unique_ptr<IntAST>(new IntAST(L | R));
    case Token::Caret:
      return std::unique_ptr<IntAST>(new IntAST(L ^ R));
    }
  }
  return BinaryOperatorAST::create(TokenKind, std::move(LHS), std::move(RHS));
}